

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void bust_a_prompt(CHAR_DATA *ch)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  EXIT_DATA *pEVar6;
  ROOM_INDEX_DATA *pRVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  short *psVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  short *psVar19;
  short *__s;
  int iVar20;
  char *pcVar21;
  char *pcVar22;
  long lVar23;
  DESCRIPTOR_DATA *pDVar24;
  char buf2 [4608];
  char buf [4608];
  char doors [4608];
  char buf3 [4608];
  short local_4838;
  undefined1 local_4836;
  char local_3638 [4];
  undefined1 auStack_3634 [4604];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar8 = is_npc(ch);
  if ((((bVar8) || (bVar8 = str_cmp(ch->prompt,""), !bVar8)) ||
      (bVar8 = str_cmp(ch->prompt,"<%hhp %mm %vmv> "), !bVar8)) ||
     (bVar8 = str_cmp(ch->prompt,"<%hhp %mm %vmv>"), !bVar8)) {
    pcVar22 = get_char_color(ch,"prompt");
    uVar18 = ch->hit;
    sVar4 = ch->mana;
    sVar5 = ch->move;
    pcVar11 = END_COLOR(ch);
    sprintf(local_3638,"%s<%dhp %dm %dmv>%s ",pcVar22,(ulong)uVar18,(ulong)(uint)(int)sVar4,
            (ulong)(uint)(int)sVar5,pcVar11);
    send_to_char(local_3638,ch);
    return;
  }
  if ((ch->comm[0] & 0x2000000) != 0) {
    send_to_char("<AFK> ",ch);
  }
  pcVar11 = get_char_color(ch,"prompt");
  pcVar22 = ch->prompt;
  pcVar12 = END_COLOR(ch);
  sprintf((char *)&local_4838,"%s%s%s",pcVar11,pcVar22,pcVar12);
  pcVar22 = local_1238;
  strcpy(pcVar22,(char *)&local_4838);
  pcVar11 = local_3638;
  iVar20 = (int)pcVar11;
  psVar19 = (short *)0x0;
  do {
    __s = &local_4838;
    iVar15 = (int)pcVar11 - iVar20;
    pcVar22 = pcVar22 + 2;
    while( true ) {
      cVar2 = pcVar22[-2];
      if (cVar2 == '\0') {
        write_to_buffer(ch->desc,local_3638,iVar15);
        return;
      }
      if (cVar2 == '%') break;
      *pcVar11 = cVar2;
      pcVar11 = pcVar11 + 1;
      iVar15 = iVar15 + 1;
      pcVar22 = pcVar22 + 1;
    }
    bVar3 = pcVar22[-1];
    if (bVar3 < 0x33) {
      if (bVar3 != 0x25) {
        if (bVar3 == 0x31) {
          iVar15 = (int)ch->max_hit;
          if (iVar15 != 0) {
            iVar10 = ch->hit;
            goto LAB_00278e09;
          }
        }
        else {
          psVar14 = (short *)0x37c12b;
          if (bVar3 != 0x32) goto switchD_002787d5_caseD_49;
          iVar15 = (int)ch->max_mana;
          if (iVar15 != 0) {
            sVar4 = ch->mana;
            goto LAB_00278e06;
          }
        }
LAB_00278e28:
        sprintf((char *)__s,"0%%");
        goto LAB_00278e3f;
      }
      sprintf((char *)__s,"%%");
      psVar14 = __s;
      goto switchD_002787d5_caseD_49;
    }
    psVar14 = (short *)0x37c12b;
    switch(bVar3) {
    case 0x48:
      uVar16 = (ulong)(uint)(int)ch->max_hit;
      goto LAB_00278c9a;
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x51:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x57:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x62:
    case 100:
    case 0x66:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6e:
    case 0x73:
    case 0x75:
    case 0x77:
    case 0x79:
      break;
    case 0x4c:
      local_4838 = (ushort)(ch->wait < 2) * 2 + 0x2b;
      psVar14 = __s;
      break;
    case 0x4d:
      uVar16 = (ulong)(uint)(int)ch->max_mana;
      goto LAB_00278c9a;
    case 0x50:
      bVar8 = is_immortal(ch);
      if ((bVar8) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) {
        uVar18 = 0;
        for (pDVar24 = descriptor_list; pDVar24 != (DESCRIPTOR_DATA *)0x0; pDVar24 = pDVar24->next)
        {
          if (pDVar24->connected == 0) {
            pRVar7 = pDVar24->character->in_room;
            if ((pRVar7 != (ROOM_INDEX_DATA *)0x0) && (pRVar7->area == ch->in_room->area)) {
              bVar8 = can_see(ch,pDVar24->character);
              uVar18 = uVar18 + bVar8;
            }
          }
        }
LAB_00278b3e:
        sprintf((char *)__s,"%i",(ulong)uVar18);
        goto LAB_00278e3f;
      }
      goto LAB_00278b30;
    case 0x52:
      bVar8 = is_immortal(ch);
      if ((!bVar8) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) {
LAB_00278b7d:
        local_4838 = 0x20;
        goto LAB_00278b8e;
      }
      uVar16 = (ulong)(uint)(int)ch->in_room->vnum;
      goto LAB_00278c06;
    case 0x56:
      uVar16 = (ulong)(uint)(int)ch->max_move;
      goto LAB_00278c9a;
    case 0x58:
      bVar8 = is_npc(ch);
      uVar16 = 0;
      if (!bVar8) {
        sVar4 = ch->level;
        iVar15 = exp_per_level(ch);
        uVar16 = (ulong)(uint)(iVar15 * sVar4 - ch->exp);
      }
LAB_00278c06:
      sprintf((char *)__s,"%d",uVar16);
      goto LAB_00278e3f;
    case 0x61:
      bVar8 = is_good(ch);
      pcVar12 = "good";
      if (!bVar8) {
        bVar8 = is_evil(ch);
        pcVar12 = "neutral";
        if (bVar8) {
          pcVar12 = "evil";
        }
      }
      goto LAB_00278d7d;
    case 99:
      local_4836 = 0;
      local_4838 = 0xd0a;
      psVar14 = __s;
      break;
    case 0x65:
      local_2438[0] = '\0';
      lVar17 = 0;
      bVar8 = false;
      do {
        lVar23 = 0;
        while ((((pEVar6 = ch->in_room->exit[lVar17 + lVar23], pEVar6 == (EXIT_DATA *)0x0 ||
                 ((pEVar6->u1).to_room == (ROOM_INDEX_DATA *)0x0)) ||
                (bVar9 = can_see_room(ch,(pEVar6->u1).to_room), !bVar9)) ||
               ((((uint)pEVar6->exit_info[0] >> 8 & 1) != 0 ||
                (((pEVar6->exit_info[0] & 2U) != 0 && (bVar9 = is_immortal(ch), !bVar9))))))) {
          lVar1 = lVar17 + lVar23;
          lVar23 = lVar23 + 1;
          if (lVar1 == 5) {
            if (!bVar8) goto LAB_00278dab;
            goto LAB_00278d91;
          }
        }
        strcat(local_2438,&DAT_0038e494 + *(int *)(&DAT_0038e494 + lVar23 * 4 + lVar17 * 4));
        lVar1 = lVar17 + lVar23;
        lVar17 = lVar17 + lVar23 + 1;
        bVar8 = true;
      } while (lVar1 != 5);
LAB_00278d91:
      bVar8 = is_affected_by(ch,0);
      if ((bVar8) && (bVar8 = is_immortal(ch), !bVar8)) {
LAB_00278dab:
        sVar13 = strlen(local_3638);
        builtin_strncpy(local_3638 + sVar13,"none",4);
        auStack_3634[sVar13] = 0;
      }
      strcpy((char *)&local_4838,local_2438);
      goto LAB_00278e3f;
    case 0x67:
      sprintf((char *)__s,"%ld",ch->gold);
      psVar14 = __s;
      break;
    case 0x68:
      uVar16 = (ulong)(uint)ch->hit;
      goto LAB_00278c9a;
    case 0x6d:
      uVar16 = (ulong)(uint)(int)ch->mana;
      goto LAB_00278c9a;
    case 0x6f:
      bVar8 = is_editing(ch);
      psVar14 = psVar19;
      if (bVar8) {
        pcVar12 = olc_ed_name(ch);
        pcVar21 = olc_ed_vnum(ch);
        sprintf((char *)__s," (%s - %s)",pcVar12,pcVar21);
        psVar14 = __s;
      }
      break;
    case 0x70:
      bVar8 = is_immortal(ch);
      if ((bVar8) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) {
        uVar18 = 0;
        for (pDVar24 = descriptor_list; pDVar24 != (DESCRIPTOR_DATA *)0x0; pDVar24 = pDVar24->next)
        {
          if (pDVar24->connected == 0) {
            pRVar7 = pDVar24->character->in_room;
            if ((pRVar7 != (ROOM_INDEX_DATA *)0x0) && (pRVar7->area == ch->in_room->area)) {
              bVar8 = is_immortal(pDVar24->character);
              uVar18 = uVar18 + !bVar8;
            }
          }
        }
        goto LAB_00278b3e;
      }
LAB_00278b30:
      local_4838 = 0x20;
LAB_00278b8e:
      local_4838 = 0x20;
      *pcVar11 = ' ';
      goto LAB_00278e59;
    case 0x71:
      uVar16 = (ulong)(uint)(int)ch->pcdata->write_next;
      goto LAB_00278c9a;
    case 0x72:
      if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
        local_4838 = 0x20;
        goto LAB_00278b8e;
      }
      bVar8 = is_npc(ch);
      if ((bVar8) || ((ch->act[0] & 0x2000) == 0)) {
        bVar8 = is_affected_by(ch,0);
        pcVar12 = "darkness";
        if (!bVar8) {
          bVar8 = room_is_dark(ch->in_room);
          pcVar12 = "darkness";
          if (!bVar8) goto LAB_00278d6e;
        }
      }
      else {
LAB_00278d6e:
        pcVar12 = get_room_name(ch->in_room);
      }
      goto LAB_00278d7d;
    case 0x74:
      uVar18 = time_info.hour +
               (((uint)(time_info.hour / 6 + (time_info.hour >> 0x1f)) >> 1) -
               (time_info.hour >> 0x1f)) * -0xc;
      if (uVar18 == 0) {
        uVar18 = 0xc;
      }
      pcVar12 = "";
      if (time_info.half != false) {
        pcVar12 = ":30";
      }
      pcVar21 = "am";
      if (0xb < time_info.hour) {
        pcVar21 = "pm";
      }
      sprintf((char *)__s,"%d%s %s",(ulong)uVar18,pcVar12,pcVar21);
      psVar14 = __s;
      break;
    case 0x76:
      uVar16 = (ulong)(uint)(int)ch->move;
      goto LAB_00278c9a;
    case 0x78:
      uVar16 = (ulong)(uint)ch->exp;
LAB_00278c9a:
      sprintf((char *)__s,"%d",uVar16);
      psVar14 = __s;
      break;
    case 0x7a:
      bVar8 = is_immortal(ch);
      if ((!bVar8) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_00278b7d;
      pcVar12 = ch->in_room->area->name;
LAB_00278d7d:
      strcpy((char *)__s,pcVar12);
LAB_00278e3f:
      psVar14 = &local_4838;
      break;
    default:
      if (bVar3 == 0x33) {
        iVar15 = (int)ch->max_move;
        if (iVar15 == 0) goto LAB_00278e28;
        sVar4 = ch->move;
LAB_00278e06:
        iVar10 = (int)sVar4;
LAB_00278e09:
        sprintf((char *)__s,"%d%s",(ulong)(uint)((iVar10 * 100) / iVar15),"%");
        goto LAB_00278e3f;
      }
      psVar14 = (short *)0x37c12b;
      if (bVar3 == 0x43) {
        bVar8 = is_immortal(ch);
        if (bVar8) {
          uVar18 = 0;
          for (pDVar24 = descriptor_list; pDVar24 != (DESCRIPTOR_DATA *)0x0; pDVar24 = pDVar24->next
              ) {
            if (pDVar24->connected == 0) {
              bVar8 = can_see(ch,pDVar24->character);
              uVar18 = uVar18 + bVar8;
            }
          }
          goto LAB_00278b3e;
        }
        goto LAB_00278b30;
      }
    }
switchD_002787d5_caseD_49:
    cVar2 = (char)*psVar14;
    *pcVar11 = cVar2;
    __s = psVar14;
    while (psVar19 = __s, cVar2 != '\0') {
LAB_00278e59:
      cVar2 = *(char *)((long)__s + 1);
      __s = (short *)((long)__s + 1);
      pcVar11[1] = cVar2;
      pcVar11 = pcVar11 + 1;
    }
  } while( true );
}

Assistant:

void bust_a_prompt(CHAR_DATA *ch)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH], buf3[MSL];
	/*const*/ char *str, *orig;
	const char *i = nullptr;
	char *point;
	char doors[MAX_INPUT_LENGTH];
	EXIT_DATA *pexit;
	int number_people;
	bool found;
	const char *dir_name[] = {"N", "E", "S", "W", "U", "D"};
	int door;
	DESCRIPTOR_DATA *d;
	point = buf;

	if (is_npc(ch)
		|| !str_cmp(ch->prompt, "")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv> ")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv>"))
	{
		sprintf(buf, "%s<%dhp %dm %dmv>%s ", get_char_color(ch, "prompt"), ch->hit, ch->mana, ch->move, END_COLOR(ch));
		send_to_char(buf, ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_AFK))
		send_to_char("<AFK> ", ch);

	sprintf(buf2, "%s%s%s", get_char_color(ch, "prompt"), ch->prompt, END_COLOR(ch));
	strcpy(&buf3[0], &buf2[0]);
	orig = &buf3[0];
	str = orig;

	while (*str != '\0')
	{
		if (*str != '%')
		{
			*point++ = *str++;
			continue;
		}

		++str;

		switch (*str)
		{
			case 'e':
				found= false;
				doors[0] = '\0';

				for (door = 0; door < 6; door++)
				{
					if ((pexit = ch->in_room->exit[door]) != nullptr
						&& pexit->u1.to_room != nullptr
						&& can_see_room(ch, pexit->u1.to_room)
						&& !IS_SET(pexit->exit_info, EX_NONOBVIOUS)
						&& (!IS_SET(pexit->exit_info, EX_CLOSED) || is_immortal(ch)))
					{
						found = true;
						strcat(doors, dir_name[door]);
					}
				}

				if (!found || (is_affected_by(ch, AFF_BLIND) && !is_immortal(ch)))
					strcat(buf, "none");

				sprintf(buf2, "%s", doors);
				i = buf2;
				break;
			case 'c':
				sprintf(buf2, "%s", "\n\r");
				i = buf2;
				break;
			case 'h':
				if (!IS_SET(ch->comm, COMM_ANSI))
					sprintf(buf2, "%d", ch->hit);
				else
					sprintf(buf2, "%d", ch->hit);

				i = buf2;
				break;
			case 'H':
				sprintf(buf2, "%d", ch->max_hit);
				i = buf2;
				break;
			case 'm':
				sprintf(buf2, "%d", ch->mana);
				i = buf2;
				break;
			case 'M':
				sprintf(buf2, "%d", ch->max_mana);
				i = buf2;
				break;
			case 'L':
				if (ch->wait > 1)
					sprintf(buf2, "+");
				else
					sprintf(buf2, "-");

				i = buf2;
				break;
			case 'v':
				sprintf(buf2, "%d", ch->move);
				i = buf2;
				break;
			case 'V':
				sprintf(buf2, "%d", ch->max_move);
				i = buf2;
				break;
			case '1':
				if (ch->max_hit == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->hit) / ch->max_hit, "%");

				i = buf2;
				break;
			case '2':
				if (ch->max_mana == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->mana) / ch->max_mana, "%");

				i = buf2;
				break;
			case '3':
				if (ch->max_move == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->move) / ch->max_move, "%");

				i = buf2;
				break;
			case 'x':
				sprintf(buf2, "%d", ch->exp);
				i = buf2;
				break;
			case 'X':
				sprintf(buf2, "%d", is_npc(ch) ? 0 : ch->level * exp_per_level(ch) - ch->exp);
				i = buf2;
				break;
			case 'g':
				sprintf(buf2, "%ld", ch->gold);
				i = buf2;
				break;
			case 'a':
				sprintf(buf2, "%s", is_good(ch) ? "good" : is_evil(ch) ? "evil" : "neutral");
				i = buf2;
				break;
			case 'r':
				if (ch->in_room != nullptr)
				{
					sprintf(buf2, "%s",
						((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT))
							|| (!is_affected_by(ch, AFF_BLIND) && !room_is_dark(ch->in_room)))
								? get_room_name(ch->in_room)
								: "darkness");
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'R':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%d", ch->in_room->vnum);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'z':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%s", ch->in_room->area->name);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'p':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& !is_immortal(d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'P':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;
					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& can_see(ch, d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'C':
				if (is_immortal(ch))
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING && can_see(ch, d->character))
							number_people++;
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case '%':
				sprintf(buf2, "%%");
				i = buf2;
				break;
			case 'o':
				if (is_editing(ch))
				{
					sprintf(buf2, " (%s - %s)", olc_ed_name(ch), olc_ed_vnum(ch));
					i = buf2;
				}
				break;
			case 't':
				sprintf(buf2, "%d%s %s",
					(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
					time_info.half ? ":30" : "",
					(time_info.hour >= 12) ? "pm" : "am");

				i = buf2;
				break;
			case 'q':
				sprintf(buf2, "%d", ch->pcdata->write_next);
				i = buf2;
				break;
			default:
				i = " ";
				break;
		}

		++str;

		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	write_to_buffer(ch->desc, buf, point - buf);
	//   free_pstring(orig);
}